

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O1

void m565_converter(uchar *from,uchar *to,int w,int delta)

{
  long lVar1;
  unsigned_short *t;
  
  dir = dir != '\x01';
  if ((bool)dir) {
    lVar1 = 1;
  }
  else {
    from = from + (w + -1) * delta;
    to = to + (long)w * 2 + -2;
    delta = -delta;
    lVar1 = -1;
  }
  if (w != 0) {
    do {
      ri = (uint)*from + (ri & 7U);
      if (0xfe < (uint)ri) {
        ri = 0xff;
      }
      from = from + delta;
      *(short *)to = (short)((uint)ri >> 3) * 0x841;
      to = (uchar *)((long)to + lVar1 * 2);
      w = w + -1;
    } while (w != 0);
  }
  return;
}

Assistant:

static void m565_converter(const uchar *from,uchar *to,int w, int delta) {
  OUTTYPE *t = (OUTTYPE *)to;
  int d, td;
  if (dir) {
    dir = 0;
    from = from+(w-1)*delta;
    t = t+(w-1)*OUTSIZE;
    d = -delta;
    td = -OUTSIZE;
  } else {
    dir = 1;
    d = delta;
    td = OUTSIZE;
  }
  int r=ri;
  for (; w--; from += d, t += td) {
    r = (r&7) + *from; if (r > 255) r = 255;
    OUTASSIGN((r>>3) * 0x841);
  }
  ri = r;
}